

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O3

int file_read(int hdl,void *buffer,long nbytes)

{
  __off64_t __off;
  int iVar1;
  size_t sVar2;
  
  if (handleTable[hdl].last_io_op == 2) {
    __off = handleTable[hdl].currentpos;
    iVar1 = fseeko64((FILE *)handleTable[hdl].fileptr,__off,0);
    if (iVar1 != 0) {
      return 0x74;
    }
    handleTable[hdl].currentpos = __off;
  }
  sVar2 = fread(buffer,1,nbytes,(FILE *)handleTable[hdl].fileptr);
  if (sVar2 == 1) {
    if ((0x20 < (ulong)*buffer) ||
       (iVar1 = 0x6b, (0x100000401U >> ((ulong)*buffer & 0x3f) & 1) == 0)) {
      iVar1 = 0x6c;
    }
  }
  else {
    iVar1 = 0x6c;
    if (sVar2 == nbytes) {
      handleTable[hdl].currentpos = handleTable[hdl].currentpos + nbytes;
      handleTable[hdl].last_io_op = 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int file_read(int hdl, void *buffer, long nbytes)
/*
  read bytes from the current position in the file
*/
{
    long nread;
    char *cptr;

    if (handleTable[hdl].last_io_op == IO_WRITE)
    {
        if (file_seek(hdl, handleTable[hdl].currentpos))
            return(SEEK_ERROR);
    }
  
    nread = (long) fread(buffer, 1, nbytes, handleTable[hdl].fileptr);

    if (nread == 1)
    {
         cptr = (char *) buffer;

         /* some editors will add a single end-of-file character to a file */
         /* Ignore it if the character is a zero, 10, or 32 */
         if (*cptr == 0 || *cptr == 10 || *cptr == 32)
             return(END_OF_FILE);
         else
             return(READ_ERROR);
    }
    else if (nread != nbytes)
    {
        return(READ_ERROR);
    }

    handleTable[hdl].currentpos += nbytes;
    handleTable[hdl].last_io_op = IO_READ;
    return(0);
}